

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNStmLabel::gen_code(CTPNStmLabel *this,int param_2,int param_3)

{
  CTPNStmEnclosing *stm;
  undefined4 in_EDX;
  undefined4 in_ESI;
  CTPNStmLabel *in_RDI;
  CTPNStmBase *unaff_retaddr;
  CTPNStmEnclosing *old_enclosing;
  CTPNStmLabel *substm;
  
  substm = in_RDI;
  stm = CTcCodeStream::set_enclosing(G_cs,(CTPNStmEnclosing *)in_RDI);
  get_goto_label(in_RDI);
  CTcPrsNode::def_label_pos((CTcCodeLabel *)CONCAT44(in_ESI,in_EDX));
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)in_RDI);
  if ((in_RDI->super_CTPNStmLabelBase).stm_ != (CTPNStm *)0x0) {
    CTPNStmBase::gen_code_substm(unaff_retaddr,(CTPNStm *)substm);
  }
  if (in_RDI->break_label_ != (CTcCodeLabel *)0x0) {
    CTcPrsNode::def_label_pos((CTcCodeLabel *)CONCAT44(in_ESI,in_EDX));
  }
  CTcCodeStream::set_enclosing(G_cs,stm);
  return;
}

Assistant:

void CTPNStmLabel::gen_code(int, int)
{
    CTPNStmEnclosing *old_enclosing;

    /* push the enclosing statement */
    old_enclosing = G_cs->set_enclosing(this);
    
    /* 
     *   Define our label position - this is where we come if someone does
     *   a 'goto' to this label.  (Note that we might not have a 'goto'
     *   label defined yet - if we weren't forward-referenced by a 'goto'
     *   statement, we won't have a label defined.  Call get_goto_label()
     *   to ensure we create a label if it doesn't already exist.)
     */
    def_label_pos(get_goto_label());

    /* 
     *   add the source location of the label - this probably will have no
     *   effect, since we don't generate any code for the label itself,
     *   but it's harmless so do it anyway to guard against weird cases 
     */
    add_debug_line_rec();

    /* 
     *   generate code for the labeled statement, discarding any
     *   calculated value
     */
    if (stm_ != 0)
        gen_code_substm(stm_);

    /* 
     *   If we have a 'break' label, it means that code within our labeled
     *   statement (i.e., nested within the label) did a 'break' to leave
     *   the labeled statement.  The target of the break is the next
     *   statement after the labeled statement, which comes next, so
     *   define the label here.  
     */
    if (break_label_ != 0)
        def_label_pos(break_label_);

    /* restore the enclosing statement */
    G_cs->set_enclosing(old_enclosing);
}